

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-make.c
# Opt level: O2

void init_race_allocs(void)

{
  wchar_t wVar1;
  angband_constants *paVar2;
  short sVar3;
  int iVar4;
  short *p;
  void *p_00;
  alloc_entry *paVar5;
  wchar_t *pwVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  
  p = (short *)mem_zalloc((ulong)((uint)z_info->max_depth * 2));
  p_00 = mem_zalloc((ulong)((uint)z_info->max_depth * 2));
  paVar2 = z_info;
  alloc_race_size = 0;
  pwVar6 = &r_info[1].rarity;
  sVar3 = 0;
  for (lVar9 = 1; lVar9 < (long)((ulong)paVar2->r_max - 1); lVar9 = lVar9 + 1) {
    if (*pwVar6 != L'\0') {
      sVar3 = sVar3 + 1;
      alloc_race_size = sVar3;
      p[pwVar6[-1]] = p[pwVar6[-1]] + 1;
    }
    pwVar6 = pwVar6 + 0x34;
  }
  for (uVar7 = 1; uVar7 < paVar2->max_depth; uVar7 = uVar7 + 1) {
    p[uVar7] = p[uVar7] + p[uVar7 - 1];
  }
  if (*p == 0) {
    quit("No town monsters!");
    sVar3 = alloc_race_size;
  }
  paVar5 = (alloc_entry *)mem_zalloc((long)sVar3 * 0x14);
  paVar2 = z_info;
  pwVar6 = &r_info[1].rarity;
  alloc_race_table = paVar5;
  for (lVar9 = 1; lVar9 < (long)((ulong)paVar2->r_max - 1); lVar9 = lVar9 + 1) {
    if (*pwVar6 != L'\0') {
      wVar1 = pwVar6[-1];
      lVar10 = (long)wVar1;
      if (lVar10 < 1) {
        lVar8 = 0;
      }
      else {
        lVar8 = (long)p[lVar10 + -1];
      }
      iVar4 = (wVar1 / 10 + 1) * (int)(100 / (long)*pwVar6);
      sVar3 = *(short *)((long)p_00 + lVar10 * 2);
      paVar5[lVar8 + sVar3].index = (int)lVar9;
      paVar5[lVar8 + sVar3].level = wVar1;
      paVar5[lVar8 + sVar3].prob1 = iVar4;
      paVar5[lVar8 + sVar3].prob2 = iVar4;
      paVar5[lVar8 + sVar3].prob3 = iVar4;
      *(short *)((long)p_00 + lVar10 * 2) = sVar3 + 1;
    }
    pwVar6 = pwVar6 + 0x34;
  }
  mem_free(p_00);
  mem_free(p);
  return;
}

Assistant:

static void init_race_allocs(void) {
	int i;
	struct monster_race *race;
	alloc_entry *table;
	int16_t *num = mem_zalloc(z_info->max_depth * sizeof(int16_t));
	int16_t *already_counted =
		mem_zalloc(z_info->max_depth * sizeof(int16_t));

	/* Size of "alloc_race_table" */
	alloc_race_size = 0;

	/* Scan the monsters (not the ghost) */
	for (i = 1; i < z_info->r_max - 1; i++) {
		/* Get the i'th race */
		race = &r_info[i];

		/* Legal monsters */
		if (race->rarity) {
			/* Count the entries */
			alloc_race_size++;

			/* Group by level */
			num[race->level]++;
		}
	}

	/* Calculate the cumultive level totals */
	for (i = 1; i < z_info->max_depth; i++) {
		/* Group by level */
		num[i] += num[i - 1];
	}

	/* Paranoia */
	if (!num[0]) quit("No town monsters!");

	/* Allocate the alloc_race_table */
	alloc_race_table = mem_zalloc(alloc_race_size * sizeof(alloc_entry));

	/* Get the table entry */
	table = alloc_race_table;

	/* Scan the monsters (not the ghost) */
	for (i = 1; i < z_info->r_max - 1; i++) {
		/* Get the i'th race */
		race = &r_info[i];

		/* Count valid races */
		if (race->rarity) {
			int p, lev, prev_lev_count, race_index;

			/* Extract this race's level */
			lev = race->level;

			/* Extract the base probability */
			p = (100 / race->rarity);

			/* Multiply by depth factor (experimental) */
			p *= (1 + lev / 10);

			/* Skip entries preceding this monster's level */
			prev_lev_count = (lev > 0) ? num[lev - 1] : 0;

			/* Skip entries already counted for this level */
			race_index = prev_lev_count + already_counted[lev];

			/* Load the entry */
			table[race_index].index = i;
			table[race_index].level = lev;
			table[race_index].prob1 = p;
			table[race_index].prob2 = p;
			table[race_index].prob3 = p;

			/* Another entry complete for this locale */
			already_counted[lev]++;
		}
	}
	mem_free(already_counted);
	mem_free(num);
}